

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nva.c
# Opt level: O2

nva_card * nva_init_smu(pci_device *dev)

{
  int iVar1;
  nva_card *__ptr;
  
  __ptr = (nva_card *)calloc(0x90,1);
  if (__ptr != (nva_card *)0x0) {
    __ptr->type = NVA_DEVICE_SMU;
    (__ptr->bus).pci = dev;
    iVar1 = pci_device_map_range(dev,dev->regions[0].base_addr,dev->regions[0].size,1,&__ptr->bar0);
    if (iVar1 == 0) {
      __ptr->bar0len = dev->regions[0].size;
      return __ptr;
    }
    fprintf(_stderr,"WARN: Can\'t probe %04x:%02x:%02x.%x\n",(ulong)dev->domain,(ulong)dev->bus,
            (ulong)dev->dev,(ulong)dev->func);
    free(__ptr);
  }
  return (nva_card *)0x0;
}

Assistant:

struct nva_card *nva_init_smu(struct pci_device *dev) {
	struct nva_card *card = calloc(sizeof *card, 1);
	if (!card)
		return 0;
	card->type = NVA_DEVICE_SMU;
	card->bus_type = NVA_BUS_PCI;
	card->bus.pci = dev;
	int ret = pci_device_map_range(dev, dev->regions[0].base_addr, dev->regions[0].size, PCI_DEV_MAP_FLAG_WRITABLE, &card->bar0);
	if (ret) {
		fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
		free(card);
		return 0;
	}
	card->bar0len = dev->regions[0].size;
	return card;
}